

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

void __thiscall Ptex::v2_2::PtexReader::readMetaData(PtexReader *this)

{
  int zipsize;
  FilePos pos;
  MetaData *pMVar1;
  size_type sVar2;
  reference pvVar3;
  size_t sVar4;
  PtexReader *in_RDI;
  vector<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
  *this_00;
  size_t size;
  size_t i;
  size_t metaDataMemUsed;
  MetaData *newmeta;
  AutoMutex locker;
  PtexReader *in_stack_ffffffffffffff68;
  MetaData *in_stack_ffffffffffffff70;
  size_type local_50;
  size_t local_48 [3];
  MetaData *local_30;
  undefined4 local_24;
  MetaData *local_10;
  MetaData **local_8;
  
  AutoLock<Ptex::v2_2::Mutex>::AutoLock
            ((AutoLock<Ptex::v2_2::Mutex> *)in_stack_ffffffffffffff70,
             (Mutex *)in_stack_ffffffffffffff68);
  if (in_RDI->_metadata == (MetaData *)0x0) {
    pMVar1 = (MetaData *)operator_new(0x58);
    MetaData::MetaData(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_48[0] = 0x58;
    local_30 = pMVar1;
    if ((in_RDI->_header).metadatamemsize != 0) {
      readMetaDataBlock(in_RDI,pMVar1,in_RDI->_metadatapos,(in_RDI->_header).metadatazipsize,
                        (in_RDI->_header).metadatamemsize,local_48);
    }
    if ((in_RDI->_extheader).lmdheadermemsize != 0) {
      readLargeMetaDataHeaders
                (in_RDI,local_30,in_RDI->_lmdheaderpos,(in_RDI->_extheader).lmdheaderzipsize,
                 (in_RDI->_extheader).lmdheadermemsize,local_48);
    }
    local_50 = 0;
    sVar2 = std::
            vector<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
            ::size(&in_RDI->_metaedits);
    for (; pMVar1 = local_30, local_50 < sVar2; local_50 = local_50 + 1) {
      this_00 = &in_RDI->_metaedits;
      pvVar3 = std::
               vector<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
               ::operator[](this_00,local_50);
      pos = pvVar3->pos;
      pvVar3 = std::
               vector<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
               ::operator[](this_00,local_50);
      zipsize = pvVar3->zipsize;
      pvVar3 = std::
               vector<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
               ::operator[](this_00,local_50);
      readMetaDataBlock(in_RDI,pMVar1,pos,zipsize,pvVar3->memsize,local_48);
    }
    local_8 = &in_RDI->_metadata;
    local_10 = local_30;
    *local_8 = local_30;
    sVar4 = MetaData::selfDataSize((MetaData *)0x13530e);
    increaseMemUsed(in_RDI,sVar4 + local_48[0]);
    local_24 = 0;
  }
  else {
    local_24 = 1;
  }
  AutoLock<Ptex::v2_2::Mutex>::~AutoLock((AutoLock<Ptex::v2_2::Mutex> *)0x135340);
  return;
}

Assistant:

void PtexReader::readMetaData()
{
    // get read lock and make sure we still need to read
    AutoMutex locker(readlock);
    if (_metadata) {
        return;
    }

    // allocate new meta data (keep local until fully initialized)
    MetaData* newmeta = new MetaData(this);
    size_t metaDataMemUsed = sizeof(MetaData);

    // read primary meta data blocks
    if (_header.metadatamemsize)
        readMetaDataBlock(newmeta, _metadatapos,
                          _header.metadatazipsize, _header.metadatamemsize, metaDataMemUsed);

    // read large meta data headers
    if (_extheader.lmdheadermemsize)
        readLargeMetaDataHeaders(newmeta, _lmdheaderpos,
                                 _extheader.lmdheaderzipsize, _extheader.lmdheadermemsize, metaDataMemUsed);

    // read meta data edits
    for (size_t i = 0, size = _metaedits.size(); i < size; i++)
        readMetaDataBlock(newmeta, _metaedits[i].pos,
                          _metaedits[i].zipsize, _metaedits[i].memsize, metaDataMemUsed);

    // store meta data
    AtomicStore(&_metadata, newmeta);
    increaseMemUsed(newmeta->selfDataSize() + metaDataMemUsed);
}